

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
     eval_subtract_n<unsigned_int*,unsigned_int*,unsigned_int*>
               (uint *r,uint *u,uint *v,unsigned_fast_type count,bool has_borrow_in)

{
  uint uVar1;
  uint *puVar2;
  unsigned_long local_40;
  local_double_limb_type uv_as_ularge;
  unsigned_fast_type i;
  uint_fast8_t has_borrow_out;
  unsigned_fast_type uStack_28;
  bool has_borrow_in_local;
  unsigned_fast_type count_local;
  uint *v_local;
  uint *u_local;
  uint *r_local;
  
  i._6_1_ = has_borrow_in;
  i._7_1_ = has_borrow_in;
  uStack_28 = count;
  count_local = (unsigned_fast_type)v;
  v_local = u;
  u_local = r;
  for (uv_as_ularge = 0; uv_as_ularge < uStack_28; uv_as_ularge = uv_as_ularge + 1) {
    local_40 = ((ulong)*v_local - (ulong)*(uint *)count_local) - (ulong)i._6_1_;
    count_local = count_local + 4;
    v_local = v_local + 1;
    uVar1 = detail::make_hi<unsigned_int,unsigned_long>(&local_40);
    i._6_1_ = uVar1 != 0;
    uVar1 = (uint)local_40;
    puVar2 = detail::advance_and_point<unsigned_int*,long>(u_local,uv_as_ularge);
    *puVar2 = uVar1;
  }
  return i._6_1_ != 0;
}

Assistant:

static constexpr auto eval_subtract_n(      ResultIterator     r,
                                                InputIteratorLeft  u,
                                                InputIteratorRight v,
                                          const unsigned_fast_type count,
                                          const bool               has_borrow_in = false) -> bool
    {
      auto has_borrow_out =
        static_cast<std::uint_fast8_t>
        (
          has_borrow_in ? static_cast<std::uint_fast8_t>(UINT8_C(1))
                        : static_cast<std::uint_fast8_t>(UINT8_C(0))
        );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      static_assert
      (
           (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<local_limb_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      using result_difference_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::difference_type;

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        const auto uv_as_ularge =
          static_cast<local_double_limb_type>
          (
              static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*u++) - *v++)
            - has_borrow_out
          );

        has_borrow_out =
          static_cast<std::uint_fast8_t>
          (
            (detail::make_hi<local_limb_type>(uv_as_ularge) != static_cast<local_limb_type>(UINT8_C(0)))
              ? static_cast<std::uint_fast8_t>(UINT8_C(1))
              : static_cast<std::uint_fast8_t>(UINT8_C(0))
          );

        *detail::advance_and_point(r, static_cast<result_difference_type>(i)) = static_cast<local_limb_type>(uv_as_ularge);
      }

      return (has_borrow_out != static_cast<std::uint_fast8_t>(UINT8_C(0)));
    }